

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

void __thiscall
QDefaultAnimationDriver::QDefaultAnimationDriver(QDefaultAnimationDriver *this,QUnifiedTimer *timer)

{
  QSlotObjectBase *pQVar1;
  long in_FS_OFFSET;
  QObject local_58;
  undefined8 local_48;
  QObject local_40;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QAnimationDriver::QAnimationDriver((QAnimationDriver *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_006ae0a0;
  *(undefined4 *)(this + 0x10) = 0;
  *(QUnifiedTimer **)(this + 0x18) = timer;
  local_58.d_ptr.d = (QObjectData *)startTimer;
  local_48 = 0;
  local_40.d_ptr.d = (QObjectData *)QAnimationDriver::started;
  local_30 = 0;
  pQVar1 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar1->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar1->m_impl =
       QtPrivate::QCallableObject<void_(QDefaultAnimationDriver::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(pQVar1 + 1) = startTimer;
  pQVar1[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            (&local_40,(QObject *)this,&local_40.d_ptr.d,(QObject *)this,&local_58.d_ptr.d,pQVar1,
             AutoConnection,(int *)0x0,&QAnimationDriver::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&local_40);
  local_58.d_ptr.d = (QObjectData *)stopTimer;
  local_48 = 0;
  local_40.d_ptr.d = (QObjectData *)QAnimationDriver::stopped;
  local_30 = 0;
  pQVar1 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar1->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar1->m_impl =
       QtPrivate::QCallableObject<void_(QDefaultAnimationDriver::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(pQVar1 + 1) = stopTimer;
  pQVar1[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            (&local_58,(QObject *)this,&local_40.d_ptr.d,(QObject *)this,&local_58.d_ptr.d,pQVar1,
             AutoConnection,(int *)0x0,&QAnimationDriver::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDefaultAnimationDriver::QDefaultAnimationDriver(QUnifiedTimer *timer)
    : QAnimationDriver(nullptr), m_unified_timer(timer)
{
    connect(this, &QAnimationDriver::started, this, &QDefaultAnimationDriver::startTimer);
    connect(this, &QAnimationDriver::stopped, this, &QDefaultAnimationDriver::stopTimer);
}